

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plotsim.cc
# Opt level: O2

int64_t linearSpeedCurve(Simulator *sim,int64_t tt)

{
  int iVar1;
  int64_t iVar2;
  
  if (linearSpeedCurve(brown::Simulator&,long)::r2 == '\0') {
    iVar1 = __cxa_guard_acquire(&linearSpeedCurve(brown::Simulator&,long)::r2);
    if (iVar1 != 0) {
      linearSpeedCurve::r2 = sim->CLKFRQ * sim->CLKFRQ;
      __cxa_guard_release(&linearSpeedCurve(brown::Simulator&,long)::r2);
    }
  }
  if (linearSpeedCurve(brown::Simulator&,long)::rv0 == '\0') {
    iVar1 = __cxa_guard_acquire(&linearSpeedCurve(brown::Simulator&,long)::rv0);
    if (iVar1 != 0) {
      linearSpeedCurve::rv0 = (long)sim->MINVEL * sim->CLKFRQ;
      __cxa_guard_release(&linearSpeedCurve(brown::Simulator&,long)::rv0);
    }
  }
  if (linearSpeedCurve(brown::Simulator&,long)::a == '\0') {
    iVar1 = __cxa_guard_acquire(&linearSpeedCurve(brown::Simulator&,long)::a);
    if (iVar1 != 0) {
      linearSpeedCurve::a = (int64_t)((sim->MAXACC << 2) / 5);
      __cxa_guard_release(&linearSpeedCurve(brown::Simulator&,long)::a);
    }
  }
  if (linearSpeedCurve(brown::Simulator&,long)::lt == '\0') {
    iVar1 = __cxa_guard_acquire(&linearSpeedCurve(brown::Simulator&,long)::lt);
    if (iVar1 != 0) {
      linearSpeedCurve::lt = (long)sim->MAXT * 2;
      __cxa_guard_release(&linearSpeedCurve(brown::Simulator&,long)::lt);
    }
  }
  if (tt < linearSpeedCurve::lt) {
    iVar2 = (int64_t)sim->MAXT;
  }
  else {
    iVar2 = linearSpeedCurve::r2 /
            ((tt - linearSpeedCurve::lt) * linearSpeedCurve::a + linearSpeedCurve::rv0);
  }
  return iVar2;
}

Assistant:

std::int64_t linearSpeedCurve(brown::Simulator& sim, std::int64_t tt) {
    static std::int64_t r2 = sim.CLKFRQ * sim.CLKFRQ;
    static std::int64_t rv0 = sim.CLKFRQ * sim.MINVEL;
    static std::int64_t a = sim.MAXACC*4/5;
    static std::int64_t lt = sim.MAXT*2; // low speed period

    std::int64_t vt = 0;
    if (tt < lt) {
        vt = sim.MAXT;
    } else {
        vt = r2/(rv0 + a*(tt-lt));
    }
    return vt;
}